

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

AssertionKind slang::ast::SemanticFacts::getAssertKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  undefined4 local_4;
  
  if (kind == AssertPropertyStatement) {
    local_4 = Assert;
  }
  else if (kind == AssumePropertyStatement) {
    local_4 = Assume;
  }
  else if (kind == CoverPropertyStatement) {
    local_4 = CoverProperty;
  }
  else if (kind == CoverSequenceStatement) {
    local_4 = CoverSequence;
  }
  else if (kind == ExpectPropertyStatement) {
    local_4 = Expect;
  }
  else if (kind == ImmediateAssertStatement) {
    local_4 = Assert;
  }
  else if (kind == ImmediateAssumeStatement) {
    local_4 = Assume;
  }
  else if (kind == ImmediateCoverStatement) {
    local_4 = CoverProperty;
  }
  else {
    local_4 = Restrict;
  }
  return local_4;
}

Assistant:

AssertionKind SemanticFacts::getAssertKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ImmediateAssertStatement: return AssertionKind::Assert;
        case SyntaxKind::ImmediateAssumeStatement: return AssertionKind::Assume;
        case SyntaxKind::ImmediateCoverStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::AssertPropertyStatement: return AssertionKind::Assert;
        case SyntaxKind::AssumePropertyStatement: return AssertionKind::Assume;
        case SyntaxKind::CoverPropertyStatement: return AssertionKind::CoverProperty;
        case SyntaxKind::CoverSequenceStatement: return AssertionKind::CoverSequence;
        case SyntaxKind::ExpectPropertyStatement: return AssertionKind::Expect;
        case SyntaxKind::RestrictPropertyStatement: return AssertionKind::Restrict;
        default: SLANG_UNREACHABLE;
    }
}